

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPLYImportExport.cpp
# Opt level: O3

bool __thiscall utPLYImportExport::exporterTest(utPLYImportExport *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Exporter exporter;
  Importer importer;
  aiScene *scene;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  Exporter local_20;
  Importer local_18;
  aiScene *local_10;
  
  Assimp::Importer::Importer(&local_18);
  Assimp::Exporter::Exporter(&local_20);
  local_10 = Assimp::Importer::ReadFile
                       (&local_18,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/PLY/cube.ply"
                        ,0x400);
  local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            (local_30,"nullptr","scene",&local_40.ptr_,&local_10);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40.ptr_ = local_40.ptr_ & 0xffffffff00000000;
  local_38.data_._0_4_ =
       Assimp::Exporter::Export
                 (&local_20,local_10,"ply",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/PLY/cube_out.ply"
                  ,0,(ExportProperties *)0x0);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            (local_30,"aiReturn_SUCCESS",
             "exporter.Export(scene, \"ply\", \"/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models\" \"/PLY/cube_out.ply\")"
             ,(aiReturn *)&local_40,(aiReturn *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::Exporter::~Exporter(&local_20);
  Assimp::Importer::~Importer(&local_18);
  return true;
}

Assistant:

virtual bool exporterTest() {
        Importer importer;
        Exporter exporter;
        const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/PLY/cube.ply", aiProcess_ValidateDataStructure);
        EXPECT_NE(nullptr, scene);
        EXPECT_EQ(aiReturn_SUCCESS, exporter.Export(scene, "ply", ASSIMP_TEST_MODELS_DIR "/PLY/cube_out.ply"));

        return true;
    }